

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryProvider.cpp
# Opt level: O3

DataDictionary * __thiscall
FIX::DataDictionaryProvider::getApplicationDataDictionary
          (DataDictionaryProvider *this,ApplVerID *applVerID)

{
  const_iterator cVar1;
  DataDictionary *pDVar2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<FIX::DataDictionary>_>_>_>
          ::find(&(this->m_applicationDictionaries)._M_t,
                 &(applVerID->super_StringField).super_FieldBase.m_string);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->m_applicationDictionaries)._M_t._M_impl.super__Rb_tree_header) {
    pDVar2 = &this->emptyDataDictionary;
  }
  else {
    pDVar2 = *(DataDictionary **)(cVar1._M_node + 2);
  }
  return pDVar2;
}

Assistant:

EXCEPT(DataDictionaryNotFound) {
  std::map<std::string, std::shared_ptr<DataDictionary>>::const_iterator find
      = m_applicationDictionaries.find(applVerID);
  if (find != m_applicationDictionaries.end()) {
    return *find->second;
  }

  return emptyDataDictionary;
}